

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloexec.c
# Opt level: O3

void noncloexec(int fd)

{
  uint uVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  
  pcVar4 = (char *)(ulong)(uint)fd;
  uVar1 = fcntl(fd,1);
  if ((int)uVar1 < 0) {
    noncloexec_cold_2();
  }
  else {
    iVar2 = fcntl(fd,2,(ulong)(uVar1 & 0x7ffffffe));
    if (-1 < iVar2) {
      return;
    }
  }
  noncloexec_cold_1();
  puVar3 = (undefined8 *)safemalloc(1,8,0);
  pcVar4 = dupstr(pcVar4);
  *puVar3 = pcVar4;
  return;
}

Assistant:

void noncloexec(int fd)
{
    int fdflags;

    fdflags = fcntl(fd, F_GETFD);
    if (fdflags < 0) {
        fprintf(stderr, "%d: fcntl(F_GETFD): %s\n", fd, strerror(errno));
        exit(1);
    }
    if (fcntl(fd, F_SETFD, fdflags & ~FD_CLOEXEC) < 0) {
        fprintf(stderr, "%d: fcntl(F_SETFD): %s\n", fd, strerror(errno));
        exit(1);
    }
}